

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O2

bool bssl::ssl_session_is_context_valid(SSL_HANDSHAKE *hs,SSL_SESSION *session)

{
  CERT *pCVar1;
  bool bVar2;
  
  if (session != (SSL_SESSION *)0x0) {
    pCVar1 = (hs->config->cert)._M_t.super___uniq_ptr_impl<bssl::CERT,_bssl::internal::Deleter>._M_t
             .super__Tuple_impl<0UL,_bssl::CERT_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::CERT_*,_false>._M_head_impl;
    bVar2 = std::__equal4<unsigned_char_const*,unsigned_char_const*>
                      ((uchar *)&session->sid_ctx,
                       (uchar *)((session->sid_ctx).storage_ + (session->sid_ctx).size_),
                       (uchar *)&pCVar1->sid_ctx,
                       (uchar *)((long)(pCVar1->sid_ctx).storage_ + (ulong)(pCVar1->sid_ctx).size_))
    ;
    return bVar2;
  }
  return false;
}

Assistant:

bool ssl_session_is_context_valid(const SSL_HANDSHAKE *hs,
                                  const SSL_SESSION *session) {
  return session != nullptr &&
         Span(session->sid_ctx) == hs->config->cert->sid_ctx;
}